

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

bool embree::extend_grid(RTCGeometry geom,vector<bool,_std::allocator<bool>_> *visited,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *left,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *top,
                        deque<unsigned_int,_std::allocator<unsigned_int>_> *right)

{
  ulong uVar1;
  bool bVar2;
  undefined4 uVar3;
  value_type vVar4;
  vector<bool,_std::allocator<bool>_> *pvVar5;
  reference pvVar6;
  size_type sVar7;
  size_type in_RDI;
  uint next_edge;
  uint opposite_face_1;
  uint opposite_edge_1;
  uint edge_1;
  size_t i_1;
  uint border1;
  uint border0;
  uint opposite_face;
  uint opposite_edge;
  uint edge;
  size_t i;
  uint prev_opposite_edge;
  value_type_conflict2 *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  value_type in_stack_ffffffffffffff44;
  size_type in_stack_ffffffffffffff58;
  vector<bool,_std::allocator<bool>_> *this;
  reference local_90;
  undefined4 local_7c;
  undefined4 local_78;
  value_type local_74;
  ulong local_70;
  int local_68;
  int local_64;
  reference local_60;
  undefined4 local_4c;
  value_type local_48;
  value_type local_44;
  vector<bool,_std::allocator<bool>_> *local_40;
  value_type local_34;
  size_type local_10;
  
  local_34 = 0xffffffff;
  local_40 = (vector<bool,_std::allocator<bool>_> *)0x0;
  local_10 = in_RDI;
  while( true ) {
    this = local_40;
    pvVar5 = (vector<bool,_std::allocator<bool>_> *)
             std::deque<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dd1f0);
    if (pvVar5 <= this) {
      for (local_70 = 0; uVar1 = local_70,
          sVar7 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dd361),
          uVar1 < sVar7; local_70 = local_70 + 1) {
        pvVar6 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (size_type)in_stack_ffffffffffffff38);
        local_74 = *pvVar6;
        local_78 = rtcGetGeometryOppositeHalfEdge(local_10,0,local_74);
        local_7c = rtcGetGeometryFace(local_10,local_78);
        local_90 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (this,in_stack_ffffffffffffff58);
        std::_Bit_reference::operator=(&local_90,true);
        uVar3 = rtcGetGeometryNextHalfEdge(local_10,local_78);
        if (local_70 == 0) {
          std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
        }
        vVar4 = rtcGetGeometryNextHalfEdge(local_10,uVar3);
        in_stack_ffffffffffffff44 = vVar4;
        pvVar6 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(vVar4,in_stack_ffffffffffffff40),
                            (size_type)in_stack_ffffffffffffff38);
        *pvVar6 = in_stack_ffffffffffffff44;
        rtcGetGeometryNextHalfEdge(local_10,vVar4);
        uVar1 = local_70;
        sVar7 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)0x1dd47a);
        if (uVar1 == sVar7 - 1) {
          std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_front
                    ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
        }
      }
      return true;
    }
    pvVar6 = std::deque<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (size_type)in_stack_ffffffffffffff38);
    local_44 = *pvVar6;
    local_48 = rtcGetGeometryOppositeHalfEdge(local_10,0,local_44);
    if (local_48 == local_44) break;
    local_4c = rtcGetGeometryFace(local_10,local_48);
    local_60 = std::vector<bool,_std::allocator<bool>_>::operator[](this,in_stack_ffffffffffffff58);
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_60);
    if (bVar2) {
      return false;
    }
    if (local_40 != (vector<bool,_std::allocator<bool>_> *)0x0) {
      in_stack_ffffffffffffff58 = local_10;
      uVar3 = rtcGetGeometryPreviousHalfEdge(local_10,local_34);
      local_64 = rtcGetGeometryOppositeHalfEdge(in_stack_ffffffffffffff58,0,uVar3);
      local_68 = rtcGetGeometryNextHalfEdge(local_10,local_48);
      if (local_64 != local_68) {
        return false;
      }
    }
    local_34 = local_48;
    local_40 = (vector<bool,_std::allocator<bool>_> *)
               ((long)&(local_40->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
  }
  return false;
}

Assistant:

bool extend_grid(RTCGeometry geom, std::vector<bool>& visited, std::deque<unsigned int>& left, std::deque<unsigned int>& top, std::deque<unsigned int>& right)
  {
    //        top
    // | <----------
    // |            /\ .
    // | left        | right 
    // |             |
    // \/            |

    
    /* test if all neighboring faces of top exist and are properly connected */
    unsigned int prev_opposite_edge = -1;
    for (size_t i=0; i<top.size(); i++)
    {
      const unsigned int edge = top[i];
      const unsigned int opposite_edge = rtcGetGeometryOppositeHalfEdge(geom,0,edge);
      if (opposite_edge == edge) return false;
      const unsigned int opposite_face = rtcGetGeometryFace(geom,opposite_edge);
      if (visited[opposite_face]) return false;

      /* test if we share an edge with the last quad */
      if (i > 0) {
        const unsigned int border0 = rtcGetGeometryOppositeHalfEdge(geom,0,rtcGetGeometryPreviousHalfEdge(geom,prev_opposite_edge));
        const unsigned int border1 = rtcGetGeometryNextHalfEdge(geom,opposite_edge);
        if (border0 != border1) return false;
      }
      prev_opposite_edge = opposite_edge;
    }

    /* extend border edges */
    for (size_t i=0; i<top.size(); i++)
    {
      const unsigned int edge = top[i];
      const unsigned int opposite_edge = rtcGetGeometryOppositeHalfEdge(geom,0,edge);
      assert(opposite_edge != edge);
      const unsigned int opposite_face = rtcGetGeometryFace(geom,opposite_edge);
      assert(!visited[opposite_face]);
      visited[opposite_face] = true;
      unsigned int next_edge = opposite_edge;
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      if (i == 0) right.push_back(next_edge);
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      top[i] = next_edge;
      next_edge = rtcGetGeometryNextHalfEdge(geom,next_edge);
      if (i == top.size()-1) left.push_front(next_edge);
    }

    return true;
  }